

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strcpy_s.c
# Opt level: O0

errno_t strcpy_s(char *dest,rsize_t dmax,char *src)

{
  char *in_RDX;
  ulong in_RSI;
  char *in_RDI;
  char *overlap_bumper;
  char *orig_dest;
  rsize_t orig_dmax;
  void *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  char *orig_dest_00;
  ulong local_18;
  char *local_10;
  errno_t local_4;
  
  if (in_RDI == (char *)0x0) {
    invoke_safe_str_constraint_handler(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0);
    local_4 = 400;
  }
  else if (in_RSI == 0) {
    invoke_safe_str_constraint_handler(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0);
    local_4 = 0x191;
  }
  else if (in_RSI < 0x1001) {
    if (in_RDX == (char *)0x0) {
      *in_RDI = '\0';
      invoke_safe_str_constraint_handler(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0);
      local_4 = 400;
    }
    else if (in_RDI == in_RDX) {
      local_4 = 0;
    }
    else {
      orig_dest_00 = in_RDX;
      local_18 = in_RSI;
      local_10 = in_RDI;
      if (in_RDI < in_RDX) {
        for (; local_18 != 0; local_18 = local_18 - 1) {
          if (local_10 == in_RDX) {
            handle_error(orig_dest_00,in_RSI,in_RDI,(errno_t)((ulong)in_RDX >> 0x20));
            return 0x194;
          }
          *local_10 = *orig_dest_00;
          if (*local_10 == '\0') {
            return 0;
          }
          local_10 = local_10 + 1;
          orig_dest_00 = orig_dest_00 + 1;
        }
      }
      else {
        for (; in_RDX = in_RDI, local_18 != 0; local_18 = local_18 - 1) {
          if (orig_dest_00 == in_RDI) {
            handle_error(orig_dest_00,in_RSI,in_RDI,(errno_t)((ulong)in_RDI >> 0x20));
            return 0x194;
          }
          *local_10 = *orig_dest_00;
          if (*local_10 == '\0') {
            return 0;
          }
          local_10 = local_10 + 1;
          orig_dest_00 = orig_dest_00 + 1;
        }
      }
      handle_error(orig_dest_00,in_RSI,in_RDI,(errno_t)((ulong)in_RDX >> 0x20));
      local_4 = 0x196;
    }
  }
  else {
    invoke_safe_str_constraint_handler(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0);
    local_4 = 0x193;
  }
  return local_4;
}

Assistant:

errno_t
strcpy_s (char *dest, rsize_t dmax, const char *src)
{
    rsize_t orig_dmax;
    char *orig_dest;
    const char *overlap_bumper;

    if (dest == NULL) {
        invoke_safe_str_constraint_handler("strcpy_s: dest is null",
                   NULL, ESNULLP);
        return RCNEGATE(ESNULLP);
    }

    if (dmax == 0) {
        invoke_safe_str_constraint_handler("strcpy_s: dmax is 0",
                   NULL, ESZEROL);
        return RCNEGATE(ESZEROL);
    }

    if (dmax > RSIZE_MAX_STR) {
        invoke_safe_str_constraint_handler("strcpy_s: dmax exceeds max",
                   NULL, ESLEMAX);
        return RCNEGATE(ESLEMAX);
    }

    if (src == NULL) {
#ifdef SAFECLIB_STR_NULL_SLACK
        /* null string to clear data */
        while (dmax) {  *dest = '\0'; dmax--; dest++; }
#else
        *dest = '\0';
#endif
        invoke_safe_str_constraint_handler("strcpy_s: src is null",
                   NULL, ESNULLP);
        return RCNEGATE(ESNULLP);
    }

    if (dest == src) {
        return RCNEGATE(EOK);
    }

    /* hold base of dest in case src was not copied */
    orig_dmax = dmax;
    orig_dest = dest;

    if (dest < src) {
        overlap_bumper = src;

        while (dmax > 0) {
            if (dest == overlap_bumper) {
                handle_error(orig_dest, orig_dmax, "strcpy_s: "
                             "overlapping objects",
                             ESOVRLP);
                return RCNEGATE(ESOVRLP);
            }

            *dest = *src;
            if (*dest == '\0') {
#ifdef SAFECLIB_STR_NULL_SLACK
                /* null slack to clear any data */
                while (dmax) { *dest = '\0'; dmax--; dest++; }
#endif
                return RCNEGATE(EOK);
            }

            dmax--;
            dest++;
            src++;
        }

    } else {
        overlap_bumper = dest;

        while (dmax > 0) {
            if (src == overlap_bumper) {
                handle_error(orig_dest, orig_dmax, "strcpy_s: "
                      "overlapping objects",
                      ESOVRLP);
                return RCNEGATE(ESOVRLP);
            }

            *dest = *src;
            if (*dest == '\0') {
#ifdef SAFECLIB_STR_NULL_SLACK
                /* null slack to clear any data */
                while (dmax) { *dest = '\0'; dmax--; dest++; }
#endif
                return RCNEGATE(EOK);
            }

            dmax--;
            dest++;
            src++;
        }
    }

    /*
     * the entire src must have been copied, if not reset dest
     * to null the string.
     */
    handle_error(orig_dest, orig_dmax, "strcpy_s: not "
                 "enough space for src",
                 ESNOSPC);
    return RCNEGATE(ESNOSPC);
}